

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O2

UniValue *
wallet::FinishTransaction
          (UniValue *__return_storage_ptr__,shared_ptr<wallet::CWallet> *pwallet,UniValue *options,
          CMutableTransaction *rawTx)

{
  long lVar1;
  CWallet *this;
  string str;
  string key;
  string key_00;
  string key_01;
  string key_02;
  mapValue_t mapValue;
  UniValue val;
  UniValue val_00;
  UniValue val_01;
  UniValue val_02;
  Span<const_unsigned_char> input;
  bool bVar2;
  bool bVar3;
  optional<common::PSBTError> oVar4;
  UniValue *pUVar5;
  long in_FS_OFFSET;
  CTransactionRef tx_00;
  undefined8 uVar6;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffb54;
  pointer in_stack_fffffffffffffb58;
  pointer in_stack_fffffffffffffb60;
  pointer in_stack_fffffffffffffb68;
  pointer in_stack_fffffffffffffb70;
  undefined1 local_488 [16];
  CMutableTransaction mtx;
  bool complete;
  UniValue local_438;
  string local_3e0 [32];
  UniValue local_3c0;
  string local_368 [32];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_348;
  UniValue local_310;
  string local_2b8 [32];
  undefined1 local_298 [136];
  CTransactionRef tx;
  UniValue local_1f0;
  string local_198 [32];
  string hex;
  undefined1 *local_158;
  undefined8 local_150;
  undefined1 local_148 [16];
  PartiallySignedTransaction psbtx;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  PartiallySignedTransaction::PartiallySignedTransaction(&psbtx,rawTx);
  CWallet::FillPSBT((pwallet->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr,&psbtx,&complete,0,false,true,(size_t *)0x0,true);
  uVar7 = 1;
  uVar6 = 0;
  oVar4 = CWallet::FillPSBT((pwallet->
                            super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                            &psbtx,&complete,0,true,false,(size_t *)0x0,true);
  if (((ulong)oVar4.super__Optional_base<common::PSBTError,_true,_true>._M_payload.
              super__Optional_payload_base<common::PSBTError> >> 0x20 & 1) == 0) {
    CMutableTransaction::CMutableTransaction(&mtx);
    complete = FinalizeAndExtractPSBT(&psbtx,&mtx);
    local_158 = local_148;
    local_150 = 0;
    local_148[0] = 0;
    str._M_string_length._0_4_ = uVar7;
    str._M_dataplus._M_p = (pointer)uVar6;
    str._M_string_length._4_4_ = in_stack_fffffffffffffb54;
    str.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffb58;
    str.field_2._8_8_ = in_stack_fffffffffffffb60;
    UniValue::UniValue(__return_storage_ptr__,VOBJ,str);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_298,"psbt",(allocator<char> *)&tx);
    bVar2 = UniValue::exists(options,(string *)local_298);
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&hex,"psbt",(allocator<char> *)(local_488 + 0xf));
      pUVar5 = UniValue::operator[](options,&hex);
      bVar2 = UniValue::get_bool(pUVar5);
      std::__cxx11::string::~string((string *)&hex);
    }
    else {
      bVar2 = false;
    }
    std::__cxx11::string::~string((string *)local_298);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_298,"add_to_wallet",(allocator<char> *)&tx);
    bVar3 = UniValue::exists(options,(string *)local_298);
    if (bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&hex,"add_to_wallet",(allocator<char> *)(local_488 + 0xf));
      pUVar5 = UniValue::operator[](options,&hex);
      bVar3 = UniValue::get_bool(pUVar5);
      std::__cxx11::string::~string((string *)&hex);
      bVar3 = !bVar3;
    }
    else {
      bVar3 = false;
    }
    std::__cxx11::string::~string((string *)local_298);
    if ((bVar2 != false) || ((byte)(complete ^ 1U | bVar3) == 1)) {
      local_298._16_8_ = 0;
      local_298._24_8_ = 0;
      local_298._0_8_ = (pointer)0x0;
      local_298._8_8_ = (pointer)0x0;
      PartiallySignedTransaction::Serialize<DataStream>(&psbtx,(DataStream *)local_298);
      std::__cxx11::string::string<std::allocator<char>>
                (local_198,"psbt",(allocator<char> *)(local_488 + 0xf));
      DataStream::str_abi_cxx11_((string *)&tx,(DataStream *)local_298);
      input.m_size = (size_t)tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi;
      input.m_data = (uchar *)tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr;
      EncodeBase64_abi_cxx11_(&hex,input);
      UniValue::
      UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (&local_1f0,&hex);
      key._M_string_length._0_4_ = uVar7;
      key._M_dataplus._M_p = (pointer)uVar6;
      key._M_string_length._4_4_ = in_stack_fffffffffffffb54;
      key.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffb58;
      key.field_2._8_8_ = in_stack_fffffffffffffb60;
      val.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb70;
      val._0_8_ = in_stack_fffffffffffffb68;
      val.val._8_24_ = _local_488;
      val._40_48_ = mtx._8_48_;
      UniValue::pushKV(__return_storage_ptr__,key,val);
      UniValue::~UniValue(&local_1f0);
      std::__cxx11::string::~string((string *)&hex);
      std::__cxx11::string::~string((string *)&tx);
      std::__cxx11::string::~string(local_198);
      std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)local_298);
    }
    if ((complete & 1U) != 0) {
      CTransaction::CTransaction((CTransaction *)local_298,&mtx);
      EncodeHexTx_abi_cxx11_(&hex,(CTransaction *)local_298);
      CTransaction::~CTransaction((CTransaction *)local_298);
      std::make_shared<CTransaction_const,CMutableTransaction>((CMutableTransaction *)&tx);
      std::__cxx11::string::string<std::allocator<char>>
                (local_2b8,"txid",(allocator<char> *)(local_488 + 0xf));
      base_blob<256u>::GetHex_abi_cxx11_
                ((string *)local_298,
                 (base_blob<256u> *)
                 &(tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  hash);
      UniValue::
      UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (&local_310,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298);
      key_00._M_string_length._0_4_ = uVar7;
      key_00._M_dataplus._M_p = (pointer)uVar6;
      key_00._M_string_length._4_4_ = in_stack_fffffffffffffb54;
      key_00.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffb58;
      key_00.field_2._8_8_ = in_stack_fffffffffffffb60;
      val_00.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb70;
      val_00._0_8_ = in_stack_fffffffffffffb68;
      val_00.val._8_24_ = _local_488;
      val_00._40_48_ = mtx._8_48_;
      UniValue::pushKV(__return_storage_ptr__,key_00,val_00);
      UniValue::~UniValue(&local_310);
      std::__cxx11::string::~string((string *)local_298);
      std::__cxx11::string::~string(local_2b8);
      if (bVar2 == false && bVar3 == false) {
        this = (pwallet->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                   &stack0xfffffffffffffb70,
                   &tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
        local_348._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_348._M_impl.super__Rb_tree_header._M_header;
        local_348._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_348._M_impl._0_8_ = 0;
        local_348._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_348._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        local_348._M_impl.super__Rb_tree_header._M_node_count = 0;
        in_stack_fffffffffffffb58 = (pointer)0x0;
        in_stack_fffffffffffffb60 = (pointer)0x0;
        in_stack_fffffffffffffb68 = (pointer)0x0;
        mapValue._M_t._M_impl.super__Rb_tree_header._M_node_count =
             (size_t)in_stack_fffffffffffffb70;
        mapValue._M_t._M_impl._0_40_ =
             ZEXT1640(CONCAT412(in_stack_fffffffffffffb54,CONCAT48(uVar7,uVar6)));
        tx_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_348;
        tx_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&stack0xfffffffffffffb70;
        local_348._M_impl.super__Rb_tree_header._M_header._M_right =
             local_348._M_impl.super__Rb_tree_header._M_header._M_left;
        CWallet::CommitTransaction
                  (this,tx_00,mapValue,
                   (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )_local_488);
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&stack0xfffffffffffffb58);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_348);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_488);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  (local_368,"hex",(allocator<char> *)local_298);
        UniValue::
        UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (&local_3c0,&hex);
        key_01._M_string_length._0_4_ = uVar7;
        key_01._M_dataplus._M_p = (pointer)uVar6;
        key_01._M_string_length._4_4_ = in_stack_fffffffffffffb54;
        key_01.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffb58;
        key_01.field_2._8_8_ = in_stack_fffffffffffffb60;
        val_01.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb70;
        val_01._0_8_ = in_stack_fffffffffffffb68;
        val_01.val._8_24_ = _local_488;
        val_01._40_48_ = mtx._8_48_;
        UniValue::pushKV(__return_storage_ptr__,key_01,val_01);
        UniValue::~UniValue(&local_3c0);
        std::__cxx11::string::~string(local_368);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      std::__cxx11::string::~string((string *)&hex);
    }
    std::__cxx11::string::string<std::allocator<char>>
              (local_3e0,"complete",(allocator<char> *)local_298);
    UniValue::UniValue<bool_&,_bool,_true>(&local_438,&complete);
    key_02._M_string_length._0_4_ = uVar7;
    key_02._M_dataplus._M_p = (pointer)uVar6;
    key_02._M_string_length._4_4_ = in_stack_fffffffffffffb54;
    key_02.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffb58;
    key_02.field_2._8_8_ = in_stack_fffffffffffffb60;
    val_02.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb70;
    val_02._0_8_ = in_stack_fffffffffffffb68;
    val_02.val._8_24_ = _local_488;
    val_02._40_48_ = mtx._8_48_;
    UniValue::pushKV(__return_storage_ptr__,key_02,val_02);
    UniValue::~UniValue(&local_438);
    std::__cxx11::string::~string(local_3e0);
    CMutableTransaction::~CMutableTransaction(&mtx);
    PartiallySignedTransaction::~PartiallySignedTransaction(&psbtx);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return __return_storage_ptr__;
    }
  }
  else {
    pUVar5 = (UniValue *)__cxa_allocate_exception(0x58);
    JSONRPCPSBTError(pUVar5,oVar4.super__Optional_base<common::PSBTError,_true,_true>._M_payload.
                            super__Optional_payload_base<common::PSBTError>._M_payload);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(pUVar5,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  __stack_chk_fail();
}

Assistant:

static UniValue FinishTransaction(const std::shared_ptr<CWallet> pwallet, const UniValue& options, const CMutableTransaction& rawTx)
{
    // Make a blank psbt
    PartiallySignedTransaction psbtx(rawTx);

    // First fill transaction with our data without signing,
    // so external signers are not asked to sign more than once.
    bool complete;
    pwallet->FillPSBT(psbtx, complete, SIGHASH_DEFAULT, /*sign=*/false, /*bip32derivs=*/true);
    const auto err{pwallet->FillPSBT(psbtx, complete, SIGHASH_DEFAULT, /*sign=*/true, /*bip32derivs=*/false)};
    if (err) {
        throw JSONRPCPSBTError(*err);
    }

    CMutableTransaction mtx;
    complete = FinalizeAndExtractPSBT(psbtx, mtx);

    UniValue result(UniValue::VOBJ);

    const bool psbt_opt_in{options.exists("psbt") && options["psbt"].get_bool()};
    bool add_to_wallet{options.exists("add_to_wallet") ? options["add_to_wallet"].get_bool() : true};
    if (psbt_opt_in || !complete || !add_to_wallet) {
        // Serialize the PSBT
        DataStream ssTx{};
        ssTx << psbtx;
        result.pushKV("psbt", EncodeBase64(ssTx.str()));
    }

    if (complete) {
        std::string hex{EncodeHexTx(CTransaction(mtx))};
        CTransactionRef tx(MakeTransactionRef(std::move(mtx)));
        result.pushKV("txid", tx->GetHash().GetHex());
        if (add_to_wallet && !psbt_opt_in) {
            pwallet->CommitTransaction(tx, {}, /*orderForm=*/{});
        } else {
            result.pushKV("hex", hex);
        }
    }
    result.pushKV("complete", complete);

    return result;
}